

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall
helics::apps::Probe::Probe
          (Probe *this,string_view appName,shared_ptr<helics::Core> *core,FederateInfo *fedInfo)

{
  string_view appName_00;
  Endpoint *in_RDI;
  FederateInfo *unaff_retaddr;
  shared_ptr<helics::Core> *in_stack_00000008;
  App *in_stack_00000010;
  size_t in_stack_00000018;
  
  appName_00._M_str = (char *)fedInfo;
  appName_00._M_len = in_stack_00000018;
  App::App(in_stack_00000010,appName_00,in_stack_00000008,unaff_retaddr);
  (in_RDI->super_Interface)._vptr_Interface = (_func_int **)&PTR__Probe_00a47720;
  Endpoint::Endpoint(in_RDI);
  *(undefined4 *)&in_RDI[2].super_Interface.mName.field_2 = 0;
  *(undefined4 *)((long)&in_RDI[2].super_Interface.mName.field_2 + 4) = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view appName,
             const std::shared_ptr<Core>& core,
             const FederateInfo& fedInfo): App(appName, core, fedInfo)
{
}